

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

_Bool cf_hc_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  ulong local_30;
  size_t i;
  cf_hc_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    for (local_30 = 0; local_30 < *(ulong *)((long)pvVar1 + 0x98); local_30 = local_30 + 1) {
      _Var2 = cf_hc_baller_data_pending
                        ((cf_hc_baller *)((long)pvVar1 + local_30 * 0x38 + 0x28),data);
      if (_Var2) {
        return true;
      }
    }
    cf_local._7_1_ = false;
  }
  else {
    cf_local._7_1_ = (*cf->next->cft->has_data_pending)(cf->next,data);
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_hc_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  for(i = 0; i < ctx->baller_count; i++)
    if(cf_hc_baller_data_pending(&ctx->ballers[i], data))
      return TRUE;
  return FALSE;
}